

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_js_api_json_autogen.h
# Opt level: O3

void __thiscall
cfd::js::api::json::PsbtOutputRequest::PsbtOutputRequest
          (PsbtOutputRequest *this,PsbtOutputRequest *param_1)

{
  pointer pcVar1;
  
  (this->super_JsonClassBase<cfd::js::api::json::PsbtOutputRequest>)._vptr_JsonClassBase =
       (_func_int **)&PTR__PsbtOutputRequest_00a829d0;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_Rb_tree(&(this->ignore_items)._M_t,&(param_1->ignore_items)._M_t);
  this->index_ = param_1->index_;
  (this->output_).super_JsonClassBase<cfd::js::api::json::PsbtOutputRequestData>._vptr_JsonClassBase
       = (_func_int **)&PTR__PsbtOutputRequestData_00a82678;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_Rb_tree(&(this->output_).ignore_items._M_t,&(param_1->output_).ignore_items._M_t);
  (this->output_).redeem_script_._M_dataplus._M_p = (pointer)&(this->output_).redeem_script_.field_2
  ;
  pcVar1 = (param_1->output_).redeem_script_._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->output_).redeem_script_,pcVar1,
             pcVar1 + (param_1->output_).redeem_script_._M_string_length);
  std::
  vector<cfd::js::api::json::PsbtBip32PubkeyInput,_std::allocator<cfd::js::api::json::PsbtBip32PubkeyInput>_>
  ::vector(&(this->output_).bip32_derives_.
            super_JsonVector<cfd::js::api::json::PsbtBip32PubkeyInput>.
            super_vector<cfd::js::api::json::PsbtBip32PubkeyInput,_std::allocator<cfd::js::api::json::PsbtBip32PubkeyInput>_>
           ,&(param_1->output_).bip32_derives_.
             super_JsonVector<cfd::js::api::json::PsbtBip32PubkeyInput>.
             super_vector<cfd::js::api::json::PsbtBip32PubkeyInput,_std::allocator<cfd::js::api::json::PsbtBip32PubkeyInput>_>
          );
  (this->output_).bip32_derives_.super_JsonVector<cfd::js::api::json::PsbtBip32PubkeyInput>.
  _vptr_JsonVector = (_func_int **)&PTR__JsonVector_00a823e8;
  std::vector<cfd::js::api::json::PsbtMapData,_std::allocator<cfd::js::api::json::PsbtMapData>_>::
  vector(&(this->output_).unknown_.super_JsonVector<cfd::js::api::json::PsbtMapData>.
          super_vector<cfd::js::api::json::PsbtMapData,_std::allocator<cfd::js::api::json::PsbtMapData>_>
         ,&(param_1->output_).unknown_.super_JsonVector<cfd::js::api::json::PsbtMapData>.
           super_vector<cfd::js::api::json::PsbtMapData,_std::allocator<cfd::js::api::json::PsbtMapData>_>
        );
  (this->output_).unknown_.super_JsonVector<cfd::js::api::json::PsbtMapData>._vptr_JsonVector =
       (_func_int **)&PTR__JsonVector_00a81070;
  return;
}

Assistant:

PsbtOutputRequest() {
    CollectFieldName();
  }